

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
ExampleUnits_unitsScalingWithUnresolvedImports_Test::
~ExampleUnits_unitsScalingWithUnresolvedImports_Test
          (ExampleUnits_unitsScalingWithUnresolvedImports_Test *this)

{
  ExampleUnits_unitsScalingWithUnresolvedImports_Test *this_local;
  
  ~ExampleUnits_unitsScalingWithUnresolvedImports_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ExampleUnits, unitsScalingWithUnresolvedImports)
{
    const std::string modelString =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"multiple_clash\">\n"
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"my_model.cellml\">\n"
        "    <units units_ref=\"my_units\" name=\"my_units\"/>\n"
        "  </import>\n"
        "  <units name=\"strange_units\">\n"
        "    <unit units=\"my_units\"/>\n"
        "    <unit exponent=\"-1\" units=\"\"/>\n"
        "  </units>\n"
        "</model>";

    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(modelString);
    auto u2 = libcellml::Units::create("units");
    u2->addUnit("banana");

    model->addUnits(u2);
    auto u1 = model->units("strange_units");

    auto scaling = libcellml::Units::scalingFactor(u1, u2, false);
    EXPECT_EQ(0.0, scaling);
}